

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

string * __thiscall cli::Parser::usage_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  pointer ppCVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  long *plVar5;
  pointer ppCVar6;
  stringstream ss;
  long *local_200;
  long local_1f0;
  long lStack_1e8;
  string *local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Available parameters:\n\n",0x17);
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar6 = (this->_commands).
                 super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_1e0 = __return_storage_ptr__,
      ppCVar6 != ppCVar1; ppCVar6 = ppCVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,((*ppCVar6)->command)._M_dataplus._M_p,
                        ((*ppCVar6)->command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,((*ppCVar6)->alternative)._M_dataplus._M_p,
               ((*ppCVar6)->alternative)._M_string_length);
    if ((*ppCVar6)->required == true) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t(required)",0xb);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,((*ppCVar6)->description)._M_dataplus._M_p,
               ((*ppCVar6)->description)._M_string_length);
    if ((*ppCVar6)->required == false) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n   ",4);
      (*(*ppCVar6)->_vptr_CmdBase[2])(local_1d8);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x1201bb);
      local_200 = &local_1f0;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_1f0 = *plVar5;
        lStack_1e8 = plVar4[3];
      }
      else {
        local_1f0 = *plVar5;
        local_200 = (long *)*plVar4;
      }
      lVar2 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,lVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'.",2);
      if (local_200 != &local_1f0) {
        operator_delete(local_200);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n\n",2);
    __return_storage_ptr__ = local_1e0;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string usage() const {
			std::stringstream ss { };
			ss << "Available parameters:\n\n";

			for (const auto& command : _commands) {
				ss << "  " << command->command << "\t" << command->alternative; 

				if (command->required == true) {
					ss << "\t(required)";
				}

				ss << "\n   " << command->description;

				if (command->required == false) {
					ss << "\n   " << "This parameter is optional. The default value is '" + command->print_value() << "'.";
				}

				ss << "\n\n";
			}

			return ss.str();
		}